

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

void CanonicalizePath(string *path,uint64_t *slash_bits)

{
  pointer path_00;
  size_t len;
  size_type local_18;
  
  local_18 = path->_M_string_length;
  if (local_18 == 0) {
    path_00 = (char *)0x0;
  }
  else {
    path_00 = (path->_M_dataplus)._M_p;
  }
  CanonicalizePath(path_00,&local_18,slash_bits);
  std::__cxx11::string::resize((ulong)path,(char)local_18);
  return;
}

Assistant:

void CanonicalizePath(string* path, uint64_t* slash_bits) {
  size_t len = path->size();
  char* str = 0;
  if (len > 0)
    str = &(*path)[0];
  CanonicalizePath(str, &len, slash_bits);
  path->resize(len);
}